

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_enumerate_states(int current_state,int *next_state,char **next_state_name)

{
  int i;
  char **next_state_name_local;
  int *next_state_local;
  int current_state_local;
  
  i = 0;
  while( true ) {
    if (0x13 < i) {
      return 0;
    }
    if (ompt_state_info[i].state_id == current_state) break;
    i = i + 1;
  }
  *next_state = ompt_state_info[i + 1].state_id;
  *next_state_name = ompt_state_info[i + 1].state_name;
  return 1;
}

Assistant:

OMPT_API_ROUTINE int ompt_enumerate_states(int current_state, int *next_state,
                                           const char **next_state_name) {
  const static int len = sizeof(ompt_state_info) / sizeof(ompt_state_info_t);
  int i = 0;

  for (i = 0; i < len - 1; i++) {
    if (ompt_state_info[i].state_id == current_state) {
      *next_state = ompt_state_info[i + 1].state_id;
      *next_state_name = ompt_state_info[i + 1].state_name;
      return 1;
    }
  }

  return 0;
}